

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int element2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = 0x33;
  pcVar2 = element7;
  switch(tok) {
  case 0x12:
    break;
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_0048a5db_caseD_13;
  case 0x14:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + enc->minBytesPerChar,end,"PCDATA");
    if (iVar1 != 0) {
      iVar1 = 0x2b;
      pcVar2 = element3;
      break;
    }
    goto switchD_0048a5db_caseD_13;
  case 0x17:
    state->level = 2;
    iVar1 = 0x2c;
    pcVar2 = element6;
    break;
  case 0x1e:
    iVar1 = 0x35;
    break;
  case 0x1f:
    iVar1 = 0x34;
    break;
  case 0x20:
    iVar1 = 0x36;
    break;
  default:
    if (tok == 0xf) {
      return 0x27;
    }
    if (tok == 0x29) break;
switchD_0048a5db_caseD_13:
    iVar1 = -1;
    pcVar2 = error;
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static int PTRCALL
element2(PROLOG_STATE *state,
         int tok,
         const char *ptr,
         const char *end,
         const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_POUND_NAME:
    if (XmlNameMatchesAscii(enc,
                            ptr + MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_PCDATA)) {
      state->handler = element3;
      return XML_ROLE_CONTENT_PCDATA;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->level = 2;
    state->handler = element6;
    return XML_ROLE_GROUP_OPEN;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT;
  case XML_TOK_NAME_QUESTION:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_OPT;
  case XML_TOK_NAME_ASTERISK:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_REP;
  case XML_TOK_NAME_PLUS:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_PLUS;
  }
  return common(state, tok);
}